

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O1

Bucket * __thiscall
dg::vr::RelationsGraph<dg::vr::ValueRelations>::getBorderBucket
          (RelationsGraph<dg::vr::ValueRelations> *this,size_t id)

{
  iterator __position;
  Bucket *__args_1;
  unsigned_long local_18;
  
  local_18 = id;
  __args_1 = getNewBucket(this);
  __position._M_current =
       (this->borderBuckets).
       super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->borderBuckets).
      super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<std::pair<unsigned_long,std::reference_wrapper<dg::vr::Bucket_const>>,std::allocator<std::pair<unsigned_long,std::reference_wrapper<dg::vr::Bucket_const>>>>
    ::_M_realloc_insert<unsigned_long&,dg::vr::Bucket_const&>
              ((vector<std::pair<unsigned_long,std::reference_wrapper<dg::vr::Bucket_const>>,std::allocator<std::pair<unsigned_long,std::reference_wrapper<dg::vr::Bucket_const>>>>
                *)&this->borderBuckets,__position,&local_18,__args_1);
  }
  else {
    (__position._M_current)->first = local_18;
    ((__position._M_current)->second)._M_data = __args_1;
    (this->borderBuckets).
    super__Vector_base<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>,_std::allocator<std::pair<unsigned_long,_std::reference_wrapper<const_dg::vr::Bucket>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return __args_1;
}

Assistant:

const Bucket &getBorderBucket(size_t id) {
        const Bucket &bucket = getNewBucket();
        assert(getBorderB(id) == nullptr);
        borderBuckets.emplace_back(id, bucket);
        return bucket;
    }